

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

bool __thiscall
node::BlockManager::WriteBlockToDisk(BlockManager *this,CBlock *block,FlatFilePos *pos)

{
  long lVar1;
  SizeComputer SVar2;
  int64_t iVar3;
  size_t __n;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  SizeComputer local_88;
  VectorFormatter<DefaultFormatter> local_79;
  ParamsStream<SizeComputer_&,_TransactionSerParams> local_78;
  AutoFile fileout;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = 0;
  OpenBlockFile(&fileout,this,pos,false);
  if (fileout.m_file == (FILE *)0x0) {
    logging_function._M_str = "WriteBlockToDisk";
    logging_function._M_len = 0x10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x65;
    LogPrintFormatInternal<char[17]>
              (logging_function,source_file,0x3cb,ALL,Error,(ConstevalFormatString<1U>)0x7d7b74,
               (char (*) [17])"WriteBlockToDisk");
  }
  else {
    local_78.m_params = &::TX_WITH_WITNESS;
    local_88.nSize = 0x50;
    local_78.m_substream = &local_88;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
              (&local_79,&local_78,&block->vtx);
    SVar2.nSize = local_88.nSize;
    AutoFile::write(&fileout,(int)(this->m_opts).chainparams + 0x170,(void *)0x4,__n);
    local_78.m_params = (TransactionSerParams *)CONCAT44(local_78.m_params._4_4_,(int)SVar2.nSize);
    AutoFile::write(&fileout,(int)&local_78,(void *)0x4,__n);
    iVar3 = AutoFile::tell(&fileout);
    pos->nPos = (uint)iVar3;
    local_78.m_params = &::TX_WITH_WITNESS;
    local_78.m_substream = (SizeComputer *)&fileout;
    CBlock::
    SerializationOps<ParamsStream<AutoFile&,TransactionSerParams>,CBlock_const,ActionSerialize>
              (block);
  }
  AutoFile::~AutoFile(&fileout);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return fileout.m_file != (FILE *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::WriteBlockToDisk(const CBlock& block, FlatFilePos& pos) const
{
    // Open history file to append
    AutoFile fileout{OpenBlockFile(pos)};
    if (fileout.IsNull()) {
        LogError("%s: OpenBlockFile failed\n", __func__);
        return false;
    }

    // Write index header
    unsigned int nSize = GetSerializeSize(TX_WITH_WITNESS(block));
    fileout << GetParams().MessageStart() << nSize;

    // Write block
    long fileOutPos = fileout.tell();
    pos.nPos = (unsigned int)fileOutPos;
    fileout << TX_WITH_WITNESS(block);

    return true;
}